

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode LocalizedText_decodeBinary(UA_LocalizedText *dst,UA_DataType *_)

{
  UA_StatusCode UVar1;
  uint local_20;
  byte local_19;
  UA_StatusCode retval;
  UA_Byte encoding;
  UA_DataType *__local;
  UA_LocalizedText *dst_local;
  
  local_19 = 0;
  _retval = _;
  __local = (UA_DataType *)dst;
  local_20 = Byte_decodeBinary(&local_19,(UA_DataType *)0x0);
  if ((local_19 & 1) != 0) {
    UVar1 = String_decodeBinary((UA_String *)__local,(UA_DataType *)0x0);
    local_20 = UVar1 | local_20;
  }
  if ((local_19 & 2) != 0) {
    UVar1 = String_decodeBinary(&(__local->typeId).identifier.string,(UA_DataType *)0x0);
    local_20 = UVar1 | local_20;
  }
  return local_20;
}

Assistant:

static UA_StatusCode
LocalizedText_decodeBinary(UA_LocalizedText *dst, const UA_DataType *_) {
    /* Decode the encoding mask */
    UA_Byte encoding = 0;
    UA_StatusCode retval = Byte_decodeBinary(&encoding, NULL);

    /* Decode the content */
    if(encoding & UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_LOCALE)
        retval |= String_decodeBinary(&dst->locale, NULL);
    if(encoding & UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_TEXT)
        retval |= String_decodeBinary(&dst->text, NULL);
    return retval;
}